

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argumentHandlers.cpp
# Opt level: O1

error_t ArgumentHandlers::mmdp_method_parse_argument(int key,char *arg,argp_state *state)

{
  void *pvVar1;
  int iVar2;
  size_t sVar3;
  ostream *poVar4;
  undefined4 uVar5;
  error_t eVar6;
  string argString;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  pvVar1 = state->input;
  if (arg == (char *)0x0) {
    arg = "";
  }
  local_40 = local_30;
  sVar3 = strlen(arg);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,arg,arg + sVar3);
  eVar6 = 7;
  if (key == 0x74) {
    iVar2 = std::__cxx11::string::compare((char *)&local_40);
    eVar6 = 0;
    uVar5 = 0;
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)&local_40);
      if (iVar2 == 0) {
        uVar5 = 1;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&local_40);
        uVar5 = 2;
        if (iVar2 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"unkown mmdp_method \'",0x14);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(char *)local_40,local_38);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'",1);
          std::endl<char,std::char_traits<char>>(poVar4);
          abort();
        }
      }
    }
    *(undefined4 *)((long)pvVar1 + 0x234) = uVar5;
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return eVar6;
}

Assistant:

error_t
mmdp_method_parse_argument (int key, char *arg, struct argp_state *state)
{
    /* Get the input argument from argp_parse, which we
      know is a pointer to our arguments structure. */
    struct Arguments *theArgumentsStruc = (struct Arguments*) state->input;
    std::string argString(arg ? arg : "");
    switch (key)
    {
        case 't': 
            if (argString=="ValueIteration")
                theArgumentsStruc->mmdp_method=ValueIteration;
            else if (argString=="PolicyIteration")
                theArgumentsStruc->mmdp_method=PolicyIteration;
            else if (argString=="PolicyIterationGPU")
                theArgumentsStruc->mmdp_method=PolicyIterationGPU;
            else
            {
                std::cerr<<"unkown mmdp_method '"<<argString<<"'"<<std::endl;
                abort();
            }
            break;
        default:
            return ARGP_ERR_UNKNOWN;
            break;
    }
    return 0;
}